

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O2

int llbuild::basic::sys::symlink(char *__from,char *__to)

{
  int iVar1;
  
  iVar1 = ::symlink(__from,__to);
  return iVar1;
}

Assistant:

int sys::symlink(const char *pointsTo, const char *linkPath) {
#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> wPointsTo;
  llvm::convertUTF8ToUTF16String(pointsTo, wPointsTo);
  llvm::SmallVector<llvm::UTF16, 20> wLinkPath;
  llvm::convertUTF8ToUTF16String(linkPath, wLinkPath);
  DWORD attributes = GetFileAttributesW((LPCWSTR)wPointsTo.data());
  DWORD directoryFlag = (attributes != INVALID_FILE_ATTRIBUTES &&
                         attributes & FILE_ATTRIBUTE_DIRECTORY)
                            ? SYMBOLIC_LINK_FLAG_DIRECTORY
                            : 0;
  // Note that CreateSymbolicLinkW takes its arguments in reverse order
  // compared to symlink/_symlink
  return !::CreateSymbolicLinkW(
      (LPCWSTR)wLinkPath.data(), (LPCWSTR)wPointsTo.data(),
      SYMBOLIC_LINK_FLAG_ALLOW_UNPRIVILEGED_CREATE | directoryFlag);
#else
  return ::symlink(pointsTo, linkPath);
#endif
}